

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cpp
# Opt level: O0

uint8_t ixy::read_io8(istream *s,size_t offset)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 local_51;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_50;
  fpos local_40 [16];
  fpos<__mbstate_t> local_30;
  uint8_t local_19;
  size_t sStack_18;
  uint8_t tmp;
  size_t offset_local;
  istream *s_local;
  
  sStack_18 = offset;
  offset_local = (size_t)s;
  std::fpos<__mbstate_t>::fpos(&local_30,offset);
  std::istream::seekg(s,local_30._M_off,local_30._M_state);
  local_40 = (fpos  [16])std::istream::tellg();
  sVar1 = std::fpos::operator_cast_to_long(local_40);
  if (sVar1 != sStack_18) {
    __assert_fail("(size_t) s.tellg() == offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp"
                  ,0x5c,"uint8_t ixy::read_io8(std::istream &, size_t)");
  }
  std::istream::read((char *)offset_local,(long)&local_19);
  uVar2 = std::ios::operator!((ios *)(offset_local + *(long *)(*(long *)offset_local + -0x18)));
  if ((uVar2 & 1) != 0) {
    memset(&local_51,0,1);
    local_50.list.second = (char *)operator<<("failed to read IO resource");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp",
               0x5f,"read_io8",&local_50);
  }
  return local_19;
}

Assistant:

auto read_io8(std::istream &s, size_t offset) -> uint8_t {
    uint8_t tmp;
    s.seekg(offset);
    assert((size_t) s.tellg() == offset);
    s.read(reinterpret_cast<char *>(&tmp), sizeof(tmp));
    if (!s) {
        error("failed to read IO resource");
    }
    return tmp;
}